

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O1

bool __thiscall QWizard::validateCurrentPage(QWizard *this)

{
  long lVar1;
  undefined1 uVar2;
  QWizardPage *pQVar3;
  long in_FS_OFFSET;
  QWizardPage *local_18;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
  local_c = *(int *)(lVar1 + 0x340);
  local_18 = (QWizardPage *)0x0;
  pQVar3 = QMap<int,_QWizardPage_*>::value
                     ((QMap<int,_QWizardPage_*> *)(lVar1 + 0x2e0),&local_c,&local_18);
  if (pQVar3 == (QWizardPage *)0x0) {
    uVar2 = 1;
  }
  else {
    uVar2 = (**(code **)(*(long *)&pQVar3->super_QWidget + 0x1b0))(pQVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)uVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QWizard::validateCurrentPage()
{
    QWizardPage *page = currentPage();
    if (!page)
        return true;

    return page->validatePage();
}